

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void iterator_suite::test_iterator_constructible(void)

{
  bool bVar1;
  reference piVar2;
  iterator bravo;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  iterator_type local_78;
  circular_view<int,_18446744073709551615UL> local_68;
  type local_48 [4];
  iterator_type local_38;
  basic_iterator<int> local_28;
  
  local_68.member.data = local_48;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_68.member.cap = 4;
  local_68.member.size = 0;
  local_68.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_68,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_68);
  *piVar2 = 0xb;
  local_78.current = local_68.member.cap * 2;
  if ((local_78.current & local_68.member.cap * 2 - 1) == 0) {
    local_78.current = local_78.current - 1 & local_68.member.next - local_68.member.size;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_78.parent = &local_68;
  local_28.parent = &local_68;
  local_28.current = local_78.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_28,&local_78);
  boost::detail::test_impl
            ("alpha == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x282,"void iterator_suite::test_iterator_constructible()",bVar1);
  local_78.parent = local_28.parent;
  local_78.current = local_28.current;
  local_38.current = local_68.member.cap * 2;
  if ((local_38.current & local_68.member.cap * 2 - 1) == 0) {
    local_38.current = local_38.current - 1 & local_68.member.next - local_68.member.size;
  }
  else {
    local_38.current = (local_68.member.next - local_68.member.size) % local_38.current;
  }
  local_38.parent = &local_68;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_78,&local_38);
  boost::detail::test_impl
            ("bravo == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x284,"void iterator_suite::test_iterator_constructible()",bVar1);
  return;
}

Assistant:

void test_iterator_constructible()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(11);
    decltype(span)::iterator alpha; // DefaultConstructible
    alpha = span.begin();
    BOOST_TEST(alpha == span.begin());
    decltype(span)::iterator bravo(alpha); // CopyConstructible
    BOOST_TEST(bravo == span.begin());
}